

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

string * __thiscall
t_rs_generator::rust_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_type *ttype)

{
  t_program *ptVar1;
  size_t __n;
  long lVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  string *name;
  string local_40;
  
  ptVar1 = (this->super_t_generator).program_;
  __n = (ttype->program_->name_)._M_string_length;
  name = &ttype->program_->name_;
  if (__n == (ptVar1->name_)._M_string_length) {
    if (__n != 0) {
      iVar3 = bcmp((name->_M_dataplus)._M_p,(ptVar1->name_)._M_dataplus._M_p,__n);
      if (iVar3 != 0) goto LAB_00345466;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
LAB_00345466:
    rust_snake_case(&local_40,this,name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_namespace(t_type* ttype) {
  if (ttype->get_program()->get_name() != get_program()->get_name()) {
    return rust_snake_case(ttype->get_program()->get_name()) + "::";
  } else {
    return "";
  }
}